

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

void __thiscall stream::slice_reader::seek(slice_reader *this,size_t slice)

{
  char cVar1;
  string *psVar2;
  int in_EDX;
  int extraout_EDX;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->current_slice == slice) {
    if (this->is == (istream *)&this->ifs) {
      cVar1 = std::__basic_file<char>::is_open();
      in_EDX = extraout_EDX;
      if (cVar1 == '\0') goto LAB_0014efbd;
    }
    return;
  }
LAB_0014efbd:
  if (this->data_offset == 0) {
    open(this,(char *)slice,in_EDX);
    return;
  }
  psVar2 = (string *)__cxa_allocate_exception(0x20);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,"cannot change slices in single-file setup","");
  std::ios_base::failure[abi:cxx11]::failure(psVar2);
  *(undefined ***)psVar2 = &PTR__failure_00173740;
  __cxa_throw(psVar2,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void slice_reader::seek(size_t slice) {
	
	if(slice == current_slice && is_open()) {
		return;
	}
	
	if(data_offset != 0) {
		throw slice_error("cannot change slices in single-file setup");
	}
	
	open(slice);
}